

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

monst * beam_hit(int ddx,int ddy,int range,int weapon,_func_int_monst_ptr_obj_ptr *fhitm,
                _func_int_obj_ptr_obj_ptr *fhito,obj *obj,boolean *obj_destroyed)

{
  ushort uVar1;
  xchar x_00;
  xchar y_00;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  monst *worm;
  char *pcVar5;
  undefined8 extraout_RAX;
  obj *poVar6;
  trap *ptVar7;
  char *pcVar8;
  char cVar9;
  int iVar10;
  undefined4 in_register_00000034;
  long lVar11;
  byte bVar12;
  undefined4 in_register_0000003c;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  int y;
  int x;
  byte local_6d;
  int local_6c;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  _func_int_monst_ptr_obj_ptr *local_40;
  _func_int_obj_ptr_obj_ptr *local_38;
  
  poVar6 = obj;
  local_60 = CONCAT44(in_register_0000003c,ddx);
  local_58 = CONCAT44(in_register_00000034,ddy);
  if (obj_destroyed != (boolean *)0x0) {
    *obj_destroyed = '\0';
  }
  local_40 = fhitm;
  local_38 = fhito;
  if (weapon == 2) {
    local_60._0_1_ = (char)ddx;
    bhitpos.x = u.ux + (char)local_60;
    local_58._0_1_ = (char)ddy;
    bhitpos.y = u.uy + (char)local_58;
    range = range + -1;
LAB_0027f691:
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      iVar10 = (int)poVar6->otyp;
    }
    else {
      iVar10 = display_rng(0x219);
      iVar10 = iVar10 + 1;
    }
    iVar10 = iVar10 + 1;
    iVar4 = -4;
  }
  else {
    bhitpos.x = u.ux;
    bhitpos.y = u.uy;
    if (weapon != 3) {
      if ((weapon & 0xfffffffbU) == 0) goto LAB_0027f6e6;
      goto LAB_0027f691;
    }
    iVar4 = -1;
    iVar10 = 0x40002;
  }
  tmp_at(iVar4,iVar10);
LAB_0027f6e6:
  local_4c = weapon - 1;
  local_48 = 0;
  bVar14 = false;
  local_68 = (ulong)(uint)weapon;
  do {
    uVar15 = local_68;
    if (range < 1) {
LAB_00280264:
      if ((uVar15 & 0xfffffffb) != 0) {
        tmp_at(-6,0);
      }
      if ((char)local_48 != '\0') {
        pay_for_damage("destroy",'\0');
      }
      return (monst *)0x0;
    }
    cVar9 = (char)local_60 + bhitpos.x;
    bVar12 = bhitpos.y + (char)local_58;
    x = (int)cVar9;
    y = (int)(char)bVar12;
    if ((0x4e < (byte)(cVar9 - 1U)) || (0x14 < bVar12)) goto LAB_00280264;
    bhitpos.x = cVar9;
    bhitpos.y = bVar12;
    if (((byte)(obj->oclass | 4U) == 6) &&
       ((objects[obj->otyp].oc_subtyp == '\x04' &&
        (cVar9 = inside_shop(level,cVar9,bVar12), cVar9 != '\0')))) {
      worm = shkcatch(obj,(xchar)x,(xchar)y);
      if (worm != (monst *)0x0) goto LAB_002802a1;
    }
    uVar15 = local_68;
    iVar4 = x;
    iVar10 = y;
    local_6d = level->locations[bhitpos.x][bhitpos.y].typ;
    local_50 = (uint)local_6d;
    if ((local_4c < 2) && (local_6d == 0x16)) {
      uVar3 = 0;
      if (bVar14) {
        uVar3 = mt_random();
        uVar3 = (uint)(uVar3 % 5 == 0);
      }
      bVar2 = hits_bars(&obj,iVar4 - (int)local_60,iVar10 - (int)local_58,(int)local_60,
                        (int)local_58,uVar3,1);
      uVar15 = local_68;
      if (bVar2 == '\0') {
        bVar14 = false;
        goto LAB_0027f85f;
      }
      if ((obj_destroyed != (boolean *)0x0) && (obj == (obj *)0x0)) {
        *obj_destroyed = '\x01';
      }
      bhitpos.x = bhitpos.x - (char)local_60;
LAB_00280258:
      bhitpos.y = bhitpos.y - (char)local_58;
      goto LAB_00280264;
    }
    if ((int)local_68 == 0) {
      bVar2 = find_drawbridge(&x,&y);
      bVar14 = true;
      if (bVar2 != '\0') {
        uVar1 = obj->otyp;
        if (uVar1 == 0x186) {
LAB_0027fcb6:
          bVar2 = is_db_wall((int)bhitpos.x,(int)bhitpos.y);
          if (bVar2 != '\0') {
            if (((viz_array[y][x] & 2U) != 0) || ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) {
              discover_object((int)obj->otyp,'\x01','\x01');
            }
            open_drawbridge(x,y);
          }
LAB_0027ff70:
          bVar14 = true;
        }
        else if (uVar1 == 0x187) {
LAB_0027ff42:
          if (local_50 == 0xc) {
            destroy_drawbridge(x,y);
            discover_object((int)obj->otyp,'\x01','\x01');
            goto LAB_0027ff70;
          }
        }
        else {
          if (uVar1 != 0x18c) {
            if (uVar1 == 0x1c4) goto LAB_0027ff42;
            if (uVar1 != 0x1cd) {
              if (uVar1 != 0x1cc) goto LAB_0027f85f;
              goto LAB_0027fcb6;
            }
          }
          if ((((viz_array[y][x] & 2U) != 0) || ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0)) &&
             (level->locations[x][y].typ == '$')) {
            discover_object((uint)uVar1,'\x01','\x01');
          }
          bVar2 = close_drawbridge(x,y);
          bVar14 = true;
          if (bVar2 == '\0') {
            return (monst *)0x0;
          }
        }
      }
    }
    else {
      bVar14 = false;
    }
LAB_0027f85f:
    local_6c = range + -1;
    lVar13 = (long)bhitpos.x;
    lVar11 = (long)bhitpos.y;
    worm = level->monsters[lVar13][lVar11];
    iVar10 = (int)uVar15;
    if ((worm == (monst *)0x0) || ((*(uint *)&worm->field_0x60 >> 9 & 1) != 0)) {
      if ((bVar14) &&
         ((obj->otyp == 0x1ce && ((level->locations[lVar13][lVar11].field_0x6 & 8) != 0)))) {
        unmap_object((int)bhitpos.x,(int)bhitpos.y);
        newsym(x,y);
      }
    }
    else {
      notonhead = true;
      if (bhitpos.x == worm->mx) {
        notonhead = bhitpos.y != worm->my;
      }
      if (iVar10 == 0) {
        (*local_40)(worm,obj);
        local_6c = range + -4;
      }
      else if (iVar10 == 3) {
        if ((*(uint *)&worm->field_0x60 & 2) == 0) goto LAB_002802a1;
        obj->ox = u.ux;
        obj->oy = u.uy;
        flash_hits_mon(worm,obj);
      }
      else {
        if (iVar10 != 4) {
          tmp_at(-6,0);
          lVar11 = (long)bhitpos.y;
          lVar13 = (long)bhitpos.x;
        }
        if ((viz_array[lVar11][lVar13] & 2U) == 0) {
          return worm;
        }
        if (worm->wormno == '\0') {
          if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0027ffff;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027febe;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027feb5;
          }
          else {
LAB_0027feb5:
            if (ublindf == (obj *)0x0) goto LAB_0028005f;
LAB_0027febe:
            if (ublindf->oartifact != '\x1d') goto LAB_0028005f;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0))
          goto LAB_0027ffff;
        }
        else {
          bVar2 = worm_known(level,worm);
          if (bVar2 != '\0') {
LAB_0027ffff:
            uVar3 = *(uint *)&worm->field_0x60;
            if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar3 & 0x280) == 0) goto LAB_0028004b;
            }
            else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0028004b:
              if ((u._1052_1_ & 0x20) == 0) {
                return worm;
              }
            }
          }
        }
LAB_0028005f:
        if (((worm->data->mflags1 & 0x10000) == 0) &&
           ((poVar6 = which_armor(worm,4), poVar6 == (obj *)0x0 ||
            (poVar6 = which_armor(worm,4), poVar6->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002800b2;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002800ad;
          }
          else {
LAB_002800ad:
            if (ublindf != (obj *)0x0) {
LAB_002800b2:
              if (ublindf->oartifact == '\x1d') goto LAB_00280152;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
              return worm;
            }
          }
LAB_00280152:
          if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
             (iVar4 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)) {
            return worm;
          }
        }
        if (u.uprops[0x42].intrinsic != 0) {
          return worm;
        }
        if (u.uprops[0x42].extrinsic != 0) {
          return worm;
        }
        bVar2 = match_warn_of_mon(worm);
        if (bVar2 != '\0') {
          return worm;
        }
        if (iVar10 != 4) {
          map_invisible(bhitpos.x,bhitpos.y);
          return worm;
        }
      }
    }
    poVar6 = obj;
    y_00 = bhitpos.y;
    x_00 = bhitpos.x;
    if (local_38 == (_func_int_obj_ptr_obj_ptr *)0x0) {
      if (iVar10 == 2) {
        if ((obj->oclass != '\f') || (level->objects[bhitpos.x][bhitpos.y] == (obj *)0x0)) {
          bVar2 = costly_spot(bhitpos.x,bhitpos.y);
          bVar2 = ship_object(poVar6,x_00,y_00,bVar2);
          if (bVar2 == '\0') goto LAB_0027f9b9;
        }
        worm = (monst *)0x0;
LAB_002802a1:
        tmp_at(-6,0);
        return worm;
      }
    }
    else {
      iVar4 = bhitpile(obj,local_38,(int)bhitpos.x,(int)bhitpos.y);
      local_6c = local_6c + -1 + (uint)(iVar4 == 0);
    }
LAB_0027f9b9:
    bVar12 = local_6d;
    if ((bVar14) && ((local_50 == 0x17 || (local_50 == 0xf)))) {
      uVar3 = (ushort)obj->otyp - 0x186;
      if ((((uVar3 < 0x3f) && ((0x4000000000000043U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) ||
          ((ushort)obj->otyp - 0x1cc < 2)) &&
         (bVar2 = doorlock(obj,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
        lVar11 = (long)bhitpos.y;
        lVar13 = (long)bhitpos.x;
        iVar4 = (int)obj->otyp;
        if (((viz_array[lVar11][lVar13] & 2U) != 0) || (iVar4 = 0x1c4, obj->otyp == 0x1c4)) {
          discover_object(iVar4,'\x01','\x01');
          lVar13 = (long)bhitpos.x;
          lVar11 = (long)bhitpos.y;
        }
        if (((*(uint *)&level->locations[lVar13][lVar11].field_0x6 & 0x1f0) == 0x10) &&
           (pcVar5 = in_rooms(level,bhitpos.x,bhitpos.y,0x12), *pcVar5 != '\0')) {
          add_damage(bhitpos.x,bhitpos.y,400);
          local_48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
      }
    }
    if ((bVar12 < 0x11) || (bVar2 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')
       ) {
      bhitpos.x = bhitpos.x - (char)local_60;
      goto LAB_00280258;
    }
    if ((uVar15 & 0xfffffffb) == 0) {
LAB_0027fbd8:
      range = local_6c;
      if ((iVar10 == 1) && ((0 < local_6c && (obj->otyp == 0x216)))) {
        poVar6 = sobj_at(0x214,level,x,y);
        if (poVar6 == (obj *)0x0) {
          if (obj == uball) {
            bVar2 = test_move(x - (int)local_60,y - (int)local_58,(int)local_60,(int)local_58,0,1);
            if (bVar2 == '\0') {
              if ((viz_array[y][x] & 2U) == 0) {
                range = 0;
              }
              else {
                pcVar5 = distant_name(obj,xname);
                The(pcVar5);
                range = 0;
                pline("%s jerks to an abrupt halt.");
              }
            }
            else if (((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
                     (ptVar7 = t_at(level,x,y), ptVar7 != (trap *)0x0)) &&
                    ((byte)((ptVar7->field_0x8 & 0x1f) - 0xb) < 4)) {
              range = 0;
            }
          }
        }
        else if ((viz_array[y][x] & 2U) == 0) {
          range = 0;
        }
        else {
          pcVar5 = distant_name(obj,xname);
          pcVar5 = The(pcVar5);
          pcVar8 = xname(poVar6);
          pcVar8 = an(pcVar8);
          range = 0;
          pline("%s hits %s.",pcVar5,pcVar8);
        }
      }
    }
    else {
      if (((level->locations[bhitpos.x][bhitpos.y].field_0x6 & 8) != 0) &&
         ((viz_array[y][x] & 2U) != 0)) {
        unmap_object((int)bhitpos.x,(int)bhitpos.y);
        newsym(x,y);
      }
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      if (iVar10 != 2) {
        if ((iVar10 == 3) || (bVar12 != 0x1f)) goto LAB_0027fbd8;
        goto LAB_00280264;
      }
      bVar2 = is_pool(level,(int)bhitpos.x,(int)bhitpos.y);
      if (((bVar2 != '\0') || (bVar2 = is_lava(level,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0'))
         || (uVar15 = local_68, range = local_6c, bVar12 == 0x1f)) goto LAB_00280264;
    }
    bVar14 = true;
  } while( true );
}

Assistant:

struct monst *beam_hit(int ddx, int ddy, int range,	/* direction and range */
		   int weapon,			/* see values in hack.h */
		   int (*fhitm)(struct monst*, struct obj*),/* fns called when mon/obj hit */
		   int (*fhito)(struct obj*, struct obj*),
		   struct obj *obj,/* object tossed/used */
		   boolean *obj_destroyed)/* has object been deallocated? may be NULL */
{
	struct monst *mtmp;
	uchar typ;
	boolean shopdoor = FALSE, point_blank = TRUE;
	if (obj_destroyed) *obj_destroyed = FALSE;

	if (weapon == KICKED_WEAPON) {
	    /* object starts one square in front of player */
	    bhitpos.x = u.ux + ddx;
	    bhitpos.y = u.uy + ddy;
	    range--;
	} else {
	    bhitpos.x = u.ux;
	    bhitpos.y = u.uy;
	}

	if (weapon == FLASHED_LIGHT) {
	    tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_flashbeam));
	} else if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM)
	    tmp_at(DISP_OBJECT, dbuf_objid(obj));

	while (range-- > 0) {
	    int x,y;

	    bhitpos.x += ddx;
	    bhitpos.y += ddy;
	    x = bhitpos.x; y = bhitpos.y;

	    if (!isok(x, y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (is_pick(obj) && inside_shop(level, x, y) &&
					   (mtmp = shkcatch(obj, x, y))) {
		tmp_at(DISP_END, 0);
		return mtmp;
	    }

	    typ = level->locations[bhitpos.x][bhitpos.y].typ;

	    /* iron bars will block anything big enough */
	    if ((weapon == THROWN_WEAPON || weapon == KICKED_WEAPON) &&
		    typ == IRONBARS &&
		    hits_bars(&obj, x - ddx, y - ddy, ddx, ddy,
			      point_blank ? 0 : !rn2(5), 1)) {
		/* caveat: obj might now be null... */
		if (obj == NULL && obj_destroyed) *obj_destroyed = TRUE;
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }

	    if (weapon == ZAPPED_WAND && find_drawbridge(&x,&y)) {
		switch (obj->otyp) {
		    case WAN_OPENING:
		    case SPE_KNOCK:
			if (is_db_wall(bhitpos.x, bhitpos.y)) {
			    if (cansee(x,y) || cansee(bhitpos.x,bhitpos.y))
				makeknown(obj->otyp);
			    open_drawbridge(x,y);
			}
			break;
		    case WAN_LOCKING:
		    case SPE_WIZARD_LOCK:
			if ((cansee(x,y) || cansee(bhitpos.x, bhitpos.y))
			    && level->locations[x][y].typ == DRAWBRIDGE_DOWN)
			    makeknown(obj->otyp);
			if (!close_drawbridge(x, y)) {
			    /* Stop the ray to prevent a door being made
			     * in the drawbridge's doorway.
			     */
			    return NULL;
			}
			break;
		    case WAN_STRIKING:
		    case SPE_FORCE_BOLT:
			/* destroy closed drawbridges, not open ones */
			if (typ == DBWALL) {
			    destroy_drawbridge(x,y);
			    makeknown(obj->otyp);
			}
			break;
		}
	    }

	    if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		notonhead = (bhitpos.x != mtmp->mx ||
			     bhitpos.y != mtmp->my);
		if (weapon != FLASHED_LIGHT) {
			if (weapon != ZAPPED_WAND) {
			    if (weapon != INVIS_BEAM) tmp_at(DISP_END, 0);
			    if (cansee(bhitpos.x,bhitpos.y) && !canspotmon(level, mtmp)) {
				if (weapon != INVIS_BEAM) {
				    map_invisible(bhitpos.x, bhitpos.y);
				    return mtmp;
				}
			    } else
				return mtmp;
			}
			if (weapon != INVIS_BEAM) {
			    (*fhitm)(mtmp, obj);
			    range -= 3;
			}
		} else {
		    /* FLASHED_LIGHT hitting invisible monster
		       should pass through instead of stop so
		       we call flash_hits_mon() directly rather
		       than returning mtmp back to caller. That
		       allows the flash to keep on going. Note
		       that we use mtmp->minvis not canspotmon()
		       because it makes no difference whether
		       the hero can see the monster or not.*/
		    if (mtmp->minvis) {
			obj->ox = u.ux,  obj->oy = u.uy;
			flash_hits_mon(mtmp, obj);
		    } else {
			tmp_at(DISP_END, 0);
		    	return mtmp; 	/* caller will call flash_hits_mon */
		    }
		}
	    } else {
		if (weapon == ZAPPED_WAND && obj->otyp == WAN_PROBING &&
		    level->locations[bhitpos.x][bhitpos.y].mem_invis) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
	    }
	    if (fhito) {
		if (bhitpile(obj,fhito,bhitpos.x,bhitpos.y))
		    range--;
	    } else {
		if (weapon == KICKED_WEAPON &&
		      ((obj->oclass == COIN_CLASS &&
			 OBJ_AT(bhitpos.x, bhitpos.y)) ||
			    ship_object(obj, bhitpos.x, bhitpos.y,
					costly_spot(bhitpos.x, bhitpos.y)))) {
			tmp_at(DISP_END, 0);
			return NULL;
		}
	    }
	    if (weapon == ZAPPED_WAND && (IS_DOOR(typ) || typ == SDOOR)) {
		switch (obj->otyp) {
		case WAN_OPENING:
		case WAN_LOCKING:
		case WAN_STRIKING:
		case SPE_KNOCK:
		case SPE_WIZARD_LOCK:
		case SPE_FORCE_BOLT:
		    if (doorlock(obj, bhitpos.x, bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y) ||
			    (obj->otyp == WAN_STRIKING))
			    makeknown(obj->otyp);
			if (level->locations[bhitpos.x][bhitpos.y].doormask == D_BROKEN
			    && *in_rooms(level, bhitpos.x, bhitpos.y, SHOPBASE)) {
			    shopdoor = TRUE;
			    add_damage(bhitpos.x, bhitpos.y, 400L);
			}
		    }
		    break;
		}
	    }
	    if (!ZAP_POS(typ) || closed_door(level, bhitpos.x, bhitpos.y)) {
		bhitpos.x -= ddx;
		bhitpos.y -= ddy;
		break;
	    }
	    if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) {
		/* 'I' present but no monster: erase */
		/* do this before the tmp_at() */
		if (level->locations[bhitpos.x][bhitpos.y].mem_invis
			&& cansee(x, y)) {
		    unmap_object(bhitpos.x, bhitpos.y);
		    newsym(x, y);
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		/* kicked objects fall in pools */
		if ((weapon == KICKED_WEAPON) &&
		   (is_pool(level, bhitpos.x, bhitpos.y) ||
		   is_lava(level, bhitpos.x, bhitpos.y)))
		    break;
		if (IS_SINK(typ) && weapon != FLASHED_LIGHT)
		    break;	/* physical objects fall onto sink */
	    }
	    /* limit range of ball so hero won't make an invalid move */
	    if (weapon == THROWN_WEAPON && range > 0 &&
		obj->otyp == HEAVY_IRON_BALL) {
		struct obj *bobj;
		struct trap *t;
		if ((bobj = sobj_at(BOULDER, level, x, y)) != 0) {
		    if (cansee(x,y))
			pline("%s hits %s.",
			      The(distant_name(obj, xname)), an(xname(bobj)));
		    range = 0;
		} else if (obj == uball) {
		    if (!test_move(x - ddx, y - ddy, ddx, ddy, 0, TEST_MOVE)) {
			/* nb: it didn't hit anything directly */
			if (cansee(x,y))
			    pline("%s jerks to an abrupt halt.",
				  The(distant_name(obj, xname))); /* lame */
			range = 0;
		    } else if (In_sokoban(&u.uz) && (t = t_at(level, x, y)) != 0 &&
			       (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
				t->ttyp == HOLE || t->ttyp == TRAPDOOR)) {
			/* hero falls into the trap, so ball stops */
			range = 0;
		    }
		}
	    }

	    /* thrown/kicked missile has moved away from its starting spot */
	    point_blank = FALSE;	/* affects passing through iron bars */
	}

	if (weapon != ZAPPED_WAND && weapon != INVIS_BEAM) tmp_at(DISP_END, 0);

	if (shopdoor)
	    pay_for_damage("destroy", FALSE);

	return NULL;
}